

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsurveyor.c
# Opt level: O1

void nn_xsurveyor_rm(nn_sockbase *self,nn_pipe *pipe)

{
  void *ptr;
  
  ptr = nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)&self[2].sock,(nn_fq_data *)((long)ptr + 0x20));
  nn_dist_rm((nn_dist *)(self + 1),(nn_dist_data *)((long)ptr + 8));
  nn_free(ptr);
  return;
}

Assistant:

void nn_xsurveyor_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xsurveyor *xsurveyor;
    struct nn_xsurveyor_data *data;

    xsurveyor = nn_cont (self, struct nn_xsurveyor, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xsurveyor->inpipes, &data->initem);
    nn_dist_rm (&xsurveyor->outpipes, &data->outitem);

    nn_free (data);
}